

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void huc1_write_rom(Emulator *e,MaskedAddress addr,u8 value)

{
  byte bVar1;
  anon_union_40_5_5d684a24_for_MemoryMapState_3 *paVar2;
  byte local_23;
  ushort local_22;
  u8 ext_ram_bank;
  u16 rom1_bank;
  Huc1 *huc1;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  paVar2 = &(e->state).memory_map_state.field_3;
  switch(addr >> 0xd) {
  case 0:
    (e->state).memory_map_state.ext_ram_enabled = (uint)((value & 0xf) == 10);
    break;
  case 1:
    (paVar2->mbc1).byte_2000_3fff = value;
    break;
  case 2:
    (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff = value;
    break;
  case 3:
    (e->state).memory_map_state.field_3.mbc1.bank_mode = value & BANK_MODE_RAM;
  }
  bVar1 = (paVar2->mbc1).byte_2000_3fff;
  local_22 = bVar1 & 0x3f;
  if ((bVar1 & 0x3f) == 0) {
    local_22 = local_22 + 1;
  }
  if ((e->state).memory_map_state.field_3.mbc1.bank_mode == BANK_MODE_ROM) {
    local_22 = local_22 | ((e->state).memory_map_state.field_3.mbc1.byte_4000_5fff & 3) << 6;
    local_23 = 0;
  }
  else {
    local_23 = (e->state).memory_map_state.field_3.mbc1.byte_4000_5fff & 3;
  }
  set_rom_bank(e,1,local_22);
  set_ext_ram_bank(e,local_23);
  return;
}

Assistant:

static void huc1_write_rom(Emulator* e, MaskedAddress addr, u8 value) {
  Huc1* huc1 = &MMAP_STATE.huc1;
  switch (addr >> 13) {
    case 0: /* 0000-1fff */
      MMAP_STATE.ext_ram_enabled =
          (value & MBC_RAM_ENABLED_MASK) == MBC_RAM_ENABLED_VALUE;
      break;
    case 1: /* 2000-3fff */
      huc1->byte_2000_3fff = value;
      break;
    case 2: /* 4000-5fff */
      huc1->byte_4000_5fff = value;
      break;
    case 3: /* 6000-7fff */
      huc1->bank_mode = (BankMode)(value & 1);
      break;
  }

  u16 rom1_bank = huc1->byte_2000_3fff & HUC1_ROM_BANK_LO_SELECT_MASK;
  if (rom1_bank == 0) {
    rom1_bank++;
  }

  u8 ext_ram_bank;
  if (huc1->bank_mode == BANK_MODE_ROM) {
    rom1_bank |= (huc1->byte_4000_5fff & HUC1_BANK_HI_SELECT_MASK)
                 << HUC1_BANK_HI_SHIFT;
    ext_ram_bank = 0;
  } else {
    ext_ram_bank = huc1->byte_4000_5fff & HUC1_BANK_HI_SELECT_MASK;
  }
  set_rom_bank(e, 1, rom1_bank);
  set_ext_ram_bank(e, ext_ram_bank);
}